

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void ecs_gauge_reduce(ecs_gauge_t *dst,int32_t t_dst,ecs_gauge_t *src,int32_t t_src)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  iVar2 = 0;
  dst->min[t_dst] = 0.0;
  dst->avg[t_dst] = 0.0;
  dst->max[t_dst] = 0.0;
  bVar3 = true;
  fVar5 = 0.0;
  fVar7 = 0.0;
  fVar6 = 0.0;
  do {
    iVar4 = (t_src + iVar2) % 0x3c;
    fVar7 = src->avg[iVar4] / 60.0 + fVar7;
    dst->avg[t_dst] = fVar7;
    fVar1 = src->min[iVar4];
    if ((bVar3) || (fVar1 < fVar5)) {
      dst->min[t_dst] = fVar1;
      fVar5 = fVar1;
    }
    fVar1 = src->max[iVar4];
    if (fVar6 < fVar1) {
      dst->max[t_dst] = fVar1;
      fVar6 = fVar1;
    }
    iVar2 = iVar2 + 1;
    bVar3 = false;
  } while (iVar2 != 0x3c);
  return;
}

Assistant:

void ecs_gauge_reduce(
    ecs_gauge_t *dst,
    int32_t t_dst,
    ecs_gauge_t *src,
    int32_t t_src)
{
    bool min_set = false;
    dst->min[t_dst] = 0;
    dst->avg[t_dst] = 0;
    dst->max[t_dst] = 0;

    int32_t i;
    for (i = 0; i < ECS_STAT_WINDOW; i ++) {
        int32_t t = (t_src + i) % ECS_STAT_WINDOW;
        dst->avg[t_dst] += src->avg[t] / (float)ECS_STAT_WINDOW;
        if (!min_set || (src->min[t] < dst->min[t_dst])) {
            dst->min[t_dst] = src->min[t];
            min_set = true;
        }
        if ((src->max[t] > dst->max[t_dst])) {
            dst->max[t_dst] = src->max[t];
        }
    }
}